

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O1

int Cnf_DataAddXorClause(void *pSat,int iVarA,int iVarB,int iVarC)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  lit Lits [3];
  int local_3c;
  int local_38;
  int local_34;
  
  if (((0 < iVarA) && (0 < iVarB)) && (0 < iVarC)) {
    iVar4 = iVarA * 2 + 1;
    iVar1 = iVarB * 2 + 1;
    iVar2 = iVarC * 2 + 1;
    local_3c = iVar4;
    local_38 = iVar1;
    local_34 = iVar2;
    iVar3 = sat_solver_addclause((sat_solver *)pSat,&local_3c,(lit *)&stack0xffffffffffffffd0);
    uVar5 = 0;
    if (iVar3 != 0) {
      local_3c = iVar4;
      local_38 = iVarB * 2;
      local_34 = iVarC * 2;
      iVar4 = sat_solver_addclause((sat_solver *)pSat,&local_3c,(lit *)&stack0xffffffffffffffd0);
      if (iVar4 == 0) {
        uVar5 = 0;
      }
      else {
        local_3c = iVarA * 2;
        local_38 = iVar1;
        local_34 = iVarC * 2;
        iVar4 = sat_solver_addclause((sat_solver *)pSat,&local_3c,(lit *)&stack0xffffffffffffffd0);
        uVar5 = 0;
        if (iVar4 != 0) {
          local_3c = iVarA * 2;
          local_38 = iVarB * 2;
          local_34 = iVar2;
          iVar4 = sat_solver_addclause((sat_solver *)pSat,&local_3c,(lit *)&stack0xffffffffffffffd0)
          ;
          uVar5 = (uint)(iVar4 != 0);
        }
      }
    }
    return uVar5;
  }
  __assert_fail("iVarA > 0 && iVarB > 0 && iVarC > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfMan.c"
                ,0x2b3,"int Cnf_DataAddXorClause(void *, int, int, int)");
}

Assistant:

int Cnf_DataAddXorClause( void * pSat, int iVarA, int iVarB, int iVarC )
{
    lit Lits[3];
    assert( iVarA > 0 && iVarB > 0 && iVarC > 0 );

    Lits[0] = toLitCond( iVarA, 1 );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 1 );
    if ( !sat_solver_addclause( (sat_solver *)pSat, Lits, Lits + 3 ) )
        return 0;

    Lits[0] = toLitCond( iVarA, 1 );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 0 );
    if ( !sat_solver_addclause( (sat_solver *)pSat, Lits, Lits + 3 ) )
        return 0;

    Lits[0] = toLitCond( iVarA, 0 );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 0 );
    if ( !sat_solver_addclause( (sat_solver *)pSat, Lits, Lits + 3 ) )
        return 0;

    Lits[0] = toLitCond( iVarA, 0 );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 1 );
    if ( !sat_solver_addclause( (sat_solver *)pSat, Lits, Lits + 3 ) )
        return 0;

    return 1;
}